

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_CHOICE.c
# Opt level: O3

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  int iVar2;
  int *piVar3;
  asn_TYPE_member_s *paVar4;
  short sVar5;
  long lVar7;
  ssize_t sVar8;
  int iVar9;
  xer_check_tag_e tcv;
  void *pvVar6;
  asn_dec_rval_t aVar15;
  undefined8 ****ppppuVar10;
  undefined8 ****ppppuVar11;
  long extraout_RDX;
  ulong uVar12;
  size_t num_1;
  size_t sVar13;
  ulong uVar14;
  pxer_chunk_type_e ch_type;
  void *memb_ptr;
  char *local_60;
  pxer_chunk_type_e local_54;
  ber_tlv_len_t *local_50;
  asn_codec_ctx_t *local_48;
  int *local_40;
  undefined8 ***local_38;
  
  local_60 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_60 = td->xml_tag;
  }
  piVar3 = (int *)td->specifics;
  pvVar6 = *struct_ptr;
  local_48 = opt_codec_ctx;
  if (pvVar6 == (void *)0x0) {
    pvVar6 = calloc(1,(long)*piVar3);
    *struct_ptr = pvVar6;
    if (pvVar6 == (void *)0x0) {
      uVar14 = 2;
      sVar13 = 0;
      goto LAB_00142858;
    }
  }
  psVar1 = (short *)((long)pvVar6 + (long)piVar3[1]);
  sVar5 = *(short *)((long)pvVar6 + (long)piVar3[1]);
  if (sVar5 == 0) {
    if (*local_60 == '\0') {
      *psVar1 = 1;
      sVar5 = 1;
    }
    else {
      sVar5 = 0;
    }
  }
  else if (4 < sVar5) {
    sVar13 = 0;
LAB_00142848:
    *psVar1 = 5;
    uVar14 = 2;
LAB_00142858:
    aVar15.consumed = sVar13;
    aVar15._0_8_ = uVar14;
    return aVar15;
  }
  uVar12 = (ulong)(uint)(int)psVar1[1];
  local_40 = (int *)(psVar1 + 2);
  local_50 = (ber_tlv_len_t *)(psVar1 + 8);
  sVar13 = 0;
LAB_0014254d:
  if (sVar5 == 2) {
    paVar4 = td->elements;
    iVar9 = (int)uVar12;
    ppppuVar10 = (undefined8 ****)((long)paVar4[iVar9].memb_offset + (long)pvVar6);
    ppppuVar11 = ppppuVar10;
    if ((paVar4[iVar9].flags & ATF_POINTER) == ATF_NOFLAGS) {
      ppppuVar11 = &local_38;
      local_38 = ppppuVar10;
    }
    aVar15.code = (*(paVar4[iVar9].type)->xer_decoder)
                            (local_48,paVar4[iVar9].type,ppppuVar11,paVar4[iVar9].name,buf_ptr,size)
    ;
    sVar13 = sVar13 + extraout_RDX;
    if (aVar15.code != (asn_dec_rval_t)0x0) {
      uVar14 = (ulong)(uint)aVar15.code;
      goto LAB_00142858;
    }
    lVar7 = (long)piVar3[2];
    iVar2 = piVar3[3];
    iVar9 = iVar9 + 1;
    if (iVar2 == 1) {
      *(char *)((long)pvVar6 + lVar7) = (char)iVar9;
    }
    else if (iVar2 == 2) {
      *(short *)((long)pvVar6 + lVar7) = (short)iVar9;
    }
    else if (iVar2 == 4) {
      *(int *)((long)pvVar6 + lVar7) = iVar9;
    }
    buf_ptr = (void *)((long)buf_ptr + extraout_RDX);
    size = size - extraout_RDX;
    *psVar1 = 3;
    sVar5 = *psVar1;
  }
  if ((sVar5 == 3) && (*local_60 == '\0')) goto LAB_00142834;
  sVar8 = xer_next_token(local_40,buf_ptr,size,&local_54);
  uVar14 = 2;
  if (sVar8 == -1) goto LAB_00142858;
  if (local_54 - PXER_TEXT < 2) goto LAB_001427fd;
  if (local_54 == PXER_WMORE) {
    uVar14 = 1;
    goto LAB_00142858;
  }
  tcv = xer_check_tag(buf_ptr,(int)sVar8,local_60);
  if (*psVar1 != 4) goto switchD_0014269c_default;
  iVar9 = xer_skip_unknown(tcv,local_50);
  switch(iVar9) {
  case 0:
    goto switchD_0014269c_caseD_0;
  case 1:
    *psVar1 = 3;
    goto switchD_0014269c_caseD_0;
  case 2:
    *psVar1 = 3;
  default:
switchD_0014269c_default:
    switch(tcv) {
    case XCT_OPENING:
      sVar5 = *psVar1;
      if (sVar5 != 0) goto LAB_001426ef;
      buf_ptr = (void *)((long)buf_ptr + sVar8);
      size = size - sVar8;
      sVar13 = sVar13 + sVar8;
      *psVar1 = 1;
      goto LAB_00142800;
    case XCT_CLOSING:
      if (*psVar1 == 3) {
        sVar13 = sVar13 + sVar8;
LAB_00142834:
        *psVar1 = 5;
        uVar14 = 0;
        goto LAB_00142858;
      }
      break;
    case XCT_UNKNOWN_OP:
    case XCT_UNKNOWN_BO:
      sVar5 = *psVar1;
LAB_001426ef:
      if (sVar5 == 1) {
        uVar12 = (ulong)(uint)td->elements_count;
        if (0 < td->elements_count) {
          lVar7 = 0x38;
          uVar14 = 0;
LAB_00142711:
          tcv = xer_check_tag(buf_ptr,(int)sVar8,*(char **)((long)&td->elements->flags + lVar7));
          switch(tcv) {
          case XCT_OPENING:
          case XCT_BOTH:
            psVar1[1] = (short)uVar14;
            *psVar1 = 2;
            uVar12 = (ulong)(uint)td->elements_count;
            goto LAB_0014277d;
          default:
            uVar12 = (ulong)(uint)td->elements_count;
            goto LAB_001427c5;
          case XCT_UNKNOWN_OP:
          case XCT_UNKNOWN_BO:
            goto switchD_00142742_caseD_5;
          }
        }
        uVar14 = 0;
LAB_0014277d:
        if ((int)uVar14 != (int)uVar12) {
          uVar12 = uVar14 & 0xffffffff;
          goto LAB_00142800;
        }
LAB_001427c5:
        if (piVar3[10] != -1) {
          sVar5 = 3;
          if ((tcv & XCT_CLOSING) == XCT_BROKEN) {
            *local_50 = 1;
            sVar5 = 4;
          }
          *psVar1 = sVar5;
          goto switchD_0014269c_caseD_0;
        }
      }
    }
    goto LAB_00142848;
  case -1:
    *psVar1 = 5;
    goto LAB_00142858;
  }
switchD_00142742_caseD_5:
  uVar14 = uVar14 + 1;
  uVar12 = (ulong)td->elements_count;
  lVar7 = lVar7 + 0x40;
  if ((long)uVar12 <= (long)uVar14) goto LAB_0014277d;
  goto LAB_00142711;
switchD_0014269c_caseD_0:
LAB_001427fd:
  size = size - sVar8;
  buf_ptr = (void *)((long)buf_ptr + sVar8);
  sVar13 = sVar13 + sVar8;
LAB_00142800:
  sVar5 = *psVar1;
  if (4 < sVar5) goto LAB_00142848;
  goto LAB_0014254d;
}

Assistant:

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_CHOICE_specifics_t *specs = (asn_CHOICE_specifics_t *)td->specifics;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value of a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */
	int edx;			/* Element index */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	if(ctx->phase == 0 && !*xml_tag)
		ctx->phase = 1;	/* Skip the outer tag checking phase */

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 * Phase 3: Only waiting for closing tag.
	 * Phase 4: Skipping unknown extensions.
	 * Phase 5: PHASED OUT
	 */
	for(edx = ctx->step; ctx->phase <= 4;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */
		asn_TYPE_member_t *elm;

		/*
		 * Go inside the member.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;
			void *memb_ptr;		/* Pointer to the member */
			void **memb_ptr2;	/* Pointer to that pointer */

			elm = &td->elements[edx];

			if(elm->flags & ATF_POINTER) {
				/* Member is a pointer to another structure */
				memb_ptr2 = (void **)((char *)st
					+ elm->memb_offset);
			} else {
				memb_ptr = (char *)st + elm->memb_offset;
				memb_ptr2 = &memb_ptr;
			}

			/* Start/Continue decoding the inner member */
			tmprval = elm->type->xer_decoder(opt_codec_ctx,
					elm->type, memb_ptr2, elm->name,
					buf_ptr, size);
			XER_ADVANCE(tmprval.consumed);
			ASN_DEBUG("XER/CHOICE: itdf: [%s] code=%d",
				elm->type->name, tmprval.code);
			if(tmprval.code != RC_OK)
				RETURN(tmprval.code);
			assert(_fetch_present_idx(st,
				specs->pres_offset, specs->pres_size) == 0);
			/* Record what we've got */
			_set_present_idx(st,
				specs->pres_offset, specs->pres_size, edx + 1);
			ctx->phase = 3;
			/* Fall through */
		}

		/* No need to wait for closing tag; special mode. */
		if(ctx->phase == 3 && !*xml_tag) {
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context, buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
			case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/CHOICE checked [%c%c%c%c] vs [%s], tcv=%d",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
		xml_tag, tcv);

		/* Skip the extensions section */
		if(ctx->phase == 4) {
			ASN_DEBUG("skip_unknown(%d, %ld)",
				tcv, (long)ctx->left);
			switch(xer_skip_unknown(tcv, &ctx->left)) {
			case -1:
				ctx->phase = 5;
				RETURN(RC_FAIL);
				continue;
			case 1:
				ctx->phase = 3;
				/* Fall through */
			case 0:
				XER_ADVANCE(ch_size);
				continue;
			case 2:
				ctx->phase = 3;
				break;
			}
		}

		switch(tcv) {
		case XCT_BOTH:
			break;	/* No CHOICE? */
		case XCT_CLOSING:
			if(ctx->phase != 3)
				break;
			XER_ADVANCE(ch_size);
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			if(ctx->phase != 1)
				break;	/* Really unexpected */

			/*
			 * Search which inner member corresponds to this tag.
			 */
			for(edx = 0; edx < td->elements_count; edx++) {
				elm = &td->elements[edx];
				tcv = xer_check_tag(buf_ptr,ch_size,elm->name);
				switch(tcv) {
				case XCT_BOTH:
				case XCT_OPENING:
					/*
					 * Process this member.
					 */
					ctx->step = edx;
					ctx->phase = 2;
					break;
				case XCT_UNKNOWN_OP:
				case XCT_UNKNOWN_BO:
					continue;
				default:
					edx = td->elements_count;
					break;	/* Phase out */
				}
				break;
			}
			if(edx != td->elements_count)
				continue;

			/* It is expected extension */
			if(specs->ext_start != -1) {
				ASN_DEBUG("Got anticipated extension");
				/*
				 * Check for (XCT_BOTH or XCT_UNKNOWN_BO)
				 * By using a mask. Only record a pure
				 * <opening> tags.
				 */
				if(tcv & XCT_CLOSING) {
					/* Found </extension> without body */
					ctx->phase = 3; /* Terminating */
				} else {
					ctx->left = 1;
					ctx->phase = 4; /* Skip ...'s */
				}
				XER_ADVANCE(ch_size);
				continue;
			}

			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag [%c%c%c%c] in CHOICE [%s]"
			" (ph=%d, tag=%s)",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
			td->name, ctx->phase, xml_tag);
		break;
	}

	ctx->phase = 5;	/* Phase out, just in case */
	RETURN(RC_FAIL);
}